

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * FxConstant::MakeConstant(PSymbol *sym,FScriptPosition *pos)

{
  bool bVar1;
  PSymbolConstNumeric *pPVar2;
  char *pcVar3;
  PSymbolConstNumeric *csym;
  FxExpression *x;
  FScriptPosition *pos_local;
  PSymbol *sym_local;
  
  pPVar2 = dyn_cast<PSymbolConstNumeric>(&sym->super_DObject);
  if (pPVar2 == (PSymbolConstNumeric *)0x0) {
    pcVar3 = FName::GetChars((FName *)&(sym->super_DObject).field_0x24);
    FScriptPosition::Message(pos,2,"\'%s\' is not a constant\n",pcVar3);
    csym = (PSymbolConstNumeric *)0x0;
  }
  else {
    bVar1 = DObject::IsA(&((pPVar2->super_PSymbolConst).ValueType)->super_DObject,
                         PInt::RegistrationInfo.MyClass);
    if (bVar1) {
      csym = (PSymbolConstNumeric *)operator_new(0x48);
      FxConstant((FxConstant *)csym,(pPVar2->field_0).Value,pos);
    }
    else {
      bVar1 = DObject::IsA(&((pPVar2->super_PSymbolConst).ValueType)->super_DObject,
                           PFloat::RegistrationInfo.MyClass);
      if (!bVar1) {
        pcVar3 = FName::GetChars((FName *)&(pPVar2->super_PSymbolConst).super_PSymbol.super_DObject.
                                           field_0x24);
        FScriptPosition::Message(pos,2,"Invalid constant \'%s\'\n",pcVar3);
        return (FxExpression *)0x0;
      }
      csym = (PSymbolConstNumeric *)operator_new(0x48);
      FxConstant((FxConstant *)csym,(pPVar2->field_0).Float,pos);
    }
  }
  return (FxExpression *)csym;
}

Assistant:

FxExpression *FxConstant::MakeConstant(PSymbol *sym, const FScriptPosition &pos)
{
	FxExpression *x;
	PSymbolConstNumeric *csym = dyn_cast<PSymbolConstNumeric>(sym);
	if (csym != NULL)
	{
		if (csym->ValueType->IsA(RUNTIME_CLASS(PInt)))
		{
			x = new FxConstant(csym->Value, pos);
		}
		else if (csym->ValueType->IsA(RUNTIME_CLASS(PFloat)))
		{
			x = new FxConstant(csym->Float, pos);
		}
		else
		{
			pos.Message(MSG_ERROR, "Invalid constant '%s'\n", csym->SymbolName.GetChars());
			return NULL;
		}
	}
	else
	{
		pos.Message(MSG_ERROR, "'%s' is not a constant\n", sym->SymbolName.GetChars());
		x = NULL;
	}
	return x;
}